

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

int __thiscall Assimp::CFIReaderImpl::getAttributeValueAsInt(CFIReaderImpl *this,int idx)

{
  bool bVar1;
  size_type sVar2;
  element_type *peVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  element_type *peVar6;
  char *__nptr;
  int local_58;
  undefined1 local_30 [8];
  shared_ptr<const_Assimp::FIIntValue> intValue;
  int idx_local;
  CFIReaderImpl *this_local;
  
  if ((-1 < idx) &&
     (intValue.super___shared_ptr<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = idx,
     sVar2 = std::
             vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
             ::size(&this->attributes), idx < (int)sVar2)) {
    std::vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
    ::operator[](&this->attributes,
                 (long)intValue.
                       super___shared_ptr<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._4_4_);
    std::dynamic_pointer_cast<Assimp::FIIntValue_const,Assimp::FIValue_const>
              ((shared_ptr<const_Assimp::FIValue> *)local_30);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      sVar2 = std::vector<int,_std::allocator<int>_>::size(&peVar3->value);
      if (sVar2 == 1) {
        peVar3 = std::
                 __shared_ptr_access<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        pvVar4 = std::vector<int,_std::allocator<int>_>::front(&peVar3->value);
        local_58 = *pvVar4;
      }
      else {
        local_58 = 0;
      }
      this_local._4_4_ = local_58;
    }
    else {
      pvVar5 = std::
               vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
               ::operator[](&this->attributes,
                            (long)intValue.
                                  super___shared_ptr<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._4_4_);
      peVar6 = std::
               __shared_ptr_access<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pvVar5->value);
      (**peVar6->_vptr_FIValue)();
      __nptr = (char *)std::__cxx11::string::c_str();
      this_local._4_4_ = atoi(__nptr);
    }
    std::shared_ptr<const_Assimp::FIIntValue>::~shared_ptr
              ((shared_ptr<const_Assimp::FIIntValue> *)local_30);
    return this_local._4_4_;
  }
  return 0;
}

Assistant:

virtual int getAttributeValueAsInt(int idx) const /*override*/ {
        if (idx < 0 || idx >= (int)attributes.size()) {
            return 0;
        }
        std::shared_ptr<const FIIntValue> intValue = std::dynamic_pointer_cast<const FIIntValue>(attributes[idx].value);
        if (intValue) {
            return intValue->value.size() == 1 ? intValue->value.front() : 0;
        }
        return atoi(attributes[idx].value->toString().c_str());
    }